

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O3

bool __thiscall
metal::scatter(metal *this,ray *r_in,hit_record *rec,color *attenuation,ray *scattered)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  vec3 p;
  undefined1 local_78 [16];
  double local_68;
  
  dVar10 = (r_in->dir).e[2];
  dVar6 = (rec->normal).e[2];
  dVar1 = this->fuzz;
  dVar11 = (r_in->dir).e[0];
  dVar12 = (r_in->dir).e[1];
  dVar4 = (rec->normal).e[0];
  dVar5 = (rec->normal).e[1];
  vec3::random();
  dVar3 = local_78._8_8_;
  dVar2 = local_78._0_8_;
  dVar7 = local_68 * local_68 + dVar2 * dVar2 + dVar3 * dVar3;
  while ((dVar7 <= 1e-160 || (1.0 < dVar7))) {
    vec3::random();
    dVar7 = local_68 * local_68 + dVar2 * dVar2 + dVar3 * dVar3;
  }
  dVar9 = dVar10 * dVar6 + dVar11 * dVar4 + dVar12 * dVar5;
  dVar9 = dVar9 + dVar9;
  dVar10 = dVar10 - dVar6 * dVar9;
  dVar8 = 1.0 / SQRT(dVar7);
  dVar6 = (rec->p).e[0];
  dVar7 = (rec->p).e[1];
  (scattered->orig).e[2] = (rec->p).e[2];
  (scattered->orig).e[0] = dVar6;
  (scattered->orig).e[1] = dVar7;
  dVar11 = dVar11 - dVar9 * dVar4;
  dVar12 = dVar12 - dVar9 * dVar5;
  dVar6 = 1.0 / SQRT(dVar10 * dVar10 + dVar11 * dVar11 + dVar12 * dVar12);
  (scattered->dir).e[0] = dVar1 * dVar8 * dVar2 + dVar6 * dVar11;
  (scattered->dir).e[1] = dVar1 * dVar8 * dVar3 + dVar6 * dVar12;
  (scattered->dir).e[2] = dVar10 * dVar6 + local_68 * dVar8 * dVar1;
  attenuation->e[2] = (this->albedo).e[2];
  dVar10 = (this->albedo).e[1];
  attenuation->e[0] = (this->albedo).e[0];
  attenuation->e[1] = dVar10;
  return 0.0 < (scattered->dir).e[2] * (rec->normal).e[2] +
               (scattered->dir).e[0] * (rec->normal).e[0] +
               (scattered->dir).e[1] * (rec->normal).e[1];
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, color& attenuation, ray& scattered)
    const override {
        vec3 reflected = reflect(r_in.direction(), rec.normal);
        reflected = unit_vector(reflected) + (fuzz * random_unit_vector());
        scattered = ray(rec.p, reflected);
        attenuation = albedo;
        return (dot(scattered.direction(), rec.normal) > 0);
    }